

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

int tcd_encode_tile(opj_tcd_t *tcd,int tileno,uchar *dest,int len,opj_codestream_info_t *cstr_info)

{
  opj_tcd_tilecomp_t *poVar1;
  OPJ_UINT32 OVar2;
  opj_cp_t *cp;
  opj_tccp_t *poVar3;
  opj_image_t *image;
  opj_tcd_tile_t *tile;
  opj_image_comp_t *poVar4;
  OPJ_INT32 *pOVar5;
  int iVar6;
  opj_packet_info_t *poVar7;
  opj_t1_t *t1;
  opj_t2_t *t2;
  int iVar8;
  int iVar9;
  opj_tcp_t *poVar10;
  int iVar11;
  int *piVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  opj_tcd_tilecomp_t *poVar17;
  long lVar18;
  int iVar19;
  opj_tile_info_t *poVar20;
  long lVar21;
  double dVar22;
  
  cp = tcd->cp;
  poVar10 = cp->tcps;
  poVar3 = poVar10->tccps;
  image = tcd->image;
  tcd->tcd_tileno = tileno;
  tile = tcd->tcd_image->tiles;
  tcd->tcd_tile = tile;
  poVar10 = poVar10 + tileno;
  tcd->tcp = poVar10;
  if (tcd->cur_tp_num == 0) {
    dVar22 = opj_clock();
    tcd->encoding_time = dVar22;
    if (cstr_info != (opj_codestream_info_t *)0x0) {
      poVar17 = tile->comps;
      if (poVar17->numresolutions < 1) {
        poVar20 = cstr_info->tile;
        iVar8 = 0;
      }
      else {
        poVar20 = cstr_info->tile;
        piVar12 = &poVar17->resolutions->pw;
        lVar16 = 0;
        iVar8 = 0;
        do {
          poVar20[tileno].pw[lVar16] = *piVar12;
          iVar14 = piVar12[1];
          poVar20[tileno].ph[lVar16] = iVar14;
          iVar8 = iVar8 + iVar14 * *piVar12;
          poVar20[tileno].pdx[lVar16] = poVar3->prcw[lVar16];
          poVar20[tileno].pdy[lVar16] = poVar3->prch[lVar16];
          lVar16 = lVar16 + 1;
          piVar12 = piVar12 + 0x26;
        } while (lVar16 < poVar17->numresolutions);
      }
      poVar7 = (opj_packet_info_t *)
               calloc((long)(iVar8 * cstr_info->numcomps * cstr_info->numlayers),0x20);
      poVar20[tileno].packet = poVar7;
    }
    if (0 < tile->numcomps) {
      poVar4 = image->comps;
      poVar17 = tile->comps;
      poVar3 = poVar10->tccps;
      lVar16 = 0;
      do {
        iVar8 = 0;
        if (poVar4[lVar16].sgnd == 0) {
          iVar8 = 1 << ((char)poVar4[lVar16].prec - 1U & 0x1f);
        }
        OVar2 = poVar4[lVar16].dx;
        iVar9 = (int)(image->x0 + OVar2 + -1) / (int)OVar2;
        iVar15 = (int)(image->y0 + poVar4[lVar16].dy + -1) / (int)poVar4[lVar16].dy;
        poVar1 = poVar17 + lVar16;
        iVar14 = poVar17[lVar16].x1;
        iVar19 = iVar14 - poVar17[lVar16].x0;
        iVar6 = (int)(~image->x0 + OVar2 + image->x1) / (int)OVar2;
        OVar2 = poVar3[lVar16].qmfbid;
        if (OVar2 == 0) {
          iVar11 = poVar1->y0;
          iVar13 = poVar1->y1;
          if (iVar11 < iVar13) {
            pOVar5 = poVar4[lVar16].data;
            piVar12 = poVar1->data;
            iVar9 = (iVar11 - iVar15) * iVar6 - iVar9;
            do {
              iVar15 = poVar1->x0;
              if (iVar15 < iVar14) {
                iVar13 = poVar1->y0;
                lVar18 = 0;
                do {
                  piVar12[(iVar11 - iVar13) * iVar19 + lVar18] =
                       (pOVar5[(iVar15 + iVar9) + lVar18] - iVar8) * 0x800;
                  iVar14 = poVar1->x1;
                  lVar18 = lVar18 + 1;
                } while ((int)lVar18 + iVar15 < iVar14);
                iVar13 = poVar1->y1;
              }
              iVar11 = iVar11 + 1;
              iVar9 = iVar9 + iVar6;
            } while (iVar11 < iVar13);
          }
        }
        else if (OVar2 == 1) {
          iVar11 = poVar1->y0;
          iVar13 = poVar1->y1;
          if (iVar11 < iVar13) {
            pOVar5 = poVar4[lVar16].data;
            piVar12 = poVar1->data;
            iVar9 = (iVar11 - iVar15) * iVar6 - iVar9;
            do {
              iVar15 = poVar1->x0;
              if (iVar15 < iVar14) {
                iVar13 = poVar1->y0;
                lVar18 = 0;
                do {
                  piVar12[(iVar11 - iVar13) * iVar19 + lVar18] =
                       pOVar5[(iVar15 + iVar9) + lVar18] - iVar8;
                  iVar14 = poVar1->x1;
                  lVar18 = lVar18 + 1;
                } while ((int)lVar18 + iVar15 < iVar14);
                iVar13 = poVar1->y1;
              }
              iVar11 = iVar11 + 1;
              iVar9 = iVar9 + iVar6;
            } while (iVar11 < iVar13);
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < tile->numcomps);
    }
    if (poVar10->mct != 0) {
      poVar17 = tile->comps;
      iVar8 = (poVar17->y1 - poVar17->y0) * (poVar17->x1 - poVar17->x0);
      if (poVar10->tccps->qmfbid == 0) {
        mct_encode_real(poVar17->data,poVar17[1].data,poVar17[2].data,iVar8);
      }
      else {
        mct_encode(poVar17->data,poVar17[1].data,poVar17[2].data,iVar8);
      }
    }
    if (0 < tile->numcomps) {
      lVar18 = 0x14;
      lVar16 = 0;
      lVar21 = 0;
      do {
        poVar17 = (opj_tcd_tilecomp_t *)((long)&tile->comps->x0 + lVar16);
        iVar8 = *(int *)((long)poVar10->tccps->stepsizes + lVar18 + -0x1c);
        if (iVar8 == 0) {
          dwt_encode_real(poVar17);
        }
        else if (iVar8 == 1) {
          dwt_encode(poVar17);
        }
        lVar21 = lVar21 + 1;
        lVar16 = lVar16 + 0x30;
        lVar18 = lVar18 + 0x438;
      } while (lVar21 < tile->numcomps);
    }
    t1 = t1_create(tcd->cinfo);
    t1_encode_cblks(t1,tile,poVar10);
    t1_destroy(t1);
    if (cstr_info != (opj_codestream_info_t *)0x0) {
      cstr_info->index_write = 0;
    }
    if ((cp->disto_alloc == 0) && (cp->fixed_quality == 0)) {
      tcd_rateallocate_fixed(tcd);
    }
    else {
      tcd_rateallocate(tcd,dest,len,cstr_info);
    }
  }
  if (cstr_info != (opj_codestream_info_t *)0x0) {
    cstr_info->index_write = 1;
  }
  t2 = t2_create(tcd->cinfo,image,cp);
  iVar8 = t2_encode_packets(t2,tileno,tile,poVar10->numlayers,dest,len,cstr_info,tcd->tp_num,
                            tcd->tp_pos,tcd->cur_pino,FINAL_PASS,tcd->cur_totnum_tp);
  t2_destroy(t2);
  if (tcd->cur_tp_num == tcd->cur_totnum_tp + -1) {
    dVar22 = opj_clock();
    tcd->encoding_time = dVar22 - tcd->encoding_time;
    opj_event_msg(tcd->cinfo,4,"- tile encoded in %f s\n");
    if (0 < tile->numcomps) {
      lVar16 = 0x20;
      lVar18 = 0;
      do {
        free(*(void **)((long)&tile->comps->x0 + lVar16));
        lVar18 = lVar18 + 1;
        lVar16 = lVar16 + 0x30;
      } while (lVar18 < tile->numcomps);
    }
  }
  return iVar8;
}

Assistant:

int tcd_encode_tile(opj_tcd_t *tcd, int tileno, unsigned char *dest, int len, opj_codestream_info_t *cstr_info) {
	int compno;
	int l, i, numpacks = 0;
	opj_tcd_tile_t *tile = NULL;
	opj_tcp_t *tcd_tcp = NULL;
	opj_cp_t *cp = NULL;

	opj_tcp_t *tcp = &tcd->cp->tcps[0];
	opj_tccp_t *tccp = &tcp->tccps[0];
	opj_image_t *image = tcd->image;
	
	opj_t1_t *t1 = NULL;		/* T1 component */
	opj_t2_t *t2 = NULL;		/* T2 component */

	tcd->tcd_tileno = tileno;
	tcd->tcd_tile = tcd->tcd_image->tiles;
	tcd->tcp = &tcd->cp->tcps[tileno];

	tile = tcd->tcd_tile;
	tcd_tcp = tcd->tcp;
	cp = tcd->cp;

	if(tcd->cur_tp_num == 0){
		tcd->encoding_time = opj_clock();	/* time needed to encode a tile */
		/* INDEX >> "Precinct_nb_X et Precinct_nb_Y" */
		if(cstr_info) {
			opj_tcd_tilecomp_t *tilec_idx = &tile->comps[0];	/* based on component 0 */
			for (i = 0; i < tilec_idx->numresolutions; i++) {
				opj_tcd_resolution_t *res_idx = &tilec_idx->resolutions[i];
				
				cstr_info->tile[tileno].pw[i] = res_idx->pw;
				cstr_info->tile[tileno].ph[i] = res_idx->ph;
				
				numpacks += res_idx->pw * res_idx->ph;
				
				cstr_info->tile[tileno].pdx[i] = tccp->prcw[i];
				cstr_info->tile[tileno].pdy[i] = tccp->prch[i];
			}
			cstr_info->tile[tileno].packet = (opj_packet_info_t*) opj_calloc(cstr_info->numcomps * cstr_info->numlayers * numpacks, sizeof(opj_packet_info_t));
		}
		/* << INDEX */
		
		/*---------------TILE-------------------*/
		
		for (compno = 0; compno < tile->numcomps; compno++) {
			int x, y;
			
			int adjust = image->comps[compno].sgnd ? 0 : 1 << (image->comps[compno].prec - 1);
			int offset_x = int_ceildiv(image->x0, image->comps[compno].dx);
			int offset_y = int_ceildiv(image->y0, image->comps[compno].dy);
			
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
			int tw = tilec->x1 - tilec->x0;
			int w = int_ceildiv(image->x1 - image->x0, image->comps[compno].dx);
			
			/* extract tile data */
			
			if (tcd_tcp->tccps[compno].qmfbid == 1) {
				for (y = tilec->y0; y < tilec->y1; y++) {
					/* start of the src tile scanline */
					int *data = &image->comps[compno].data[(tilec->x0 - offset_x) + (y - offset_y) * w];
					/* start of the dst tile scanline */
					int *tile_data = &tilec->data[(y - tilec->y0) * tw];
					for (x = tilec->x0; x < tilec->x1; x++) {
						*tile_data++ = *data++ - adjust;
					}
				}
			} else if (tcd_tcp->tccps[compno].qmfbid == 0) {
				for (y = tilec->y0; y < tilec->y1; y++) {
					/* start of the src tile scanline */
					int *data = &image->comps[compno].data[(tilec->x0 - offset_x) + (y - offset_y) * w];
					/* start of the dst tile scanline */
					int *tile_data = &tilec->data[(y - tilec->y0) * tw];
					for (x = tilec->x0; x < tilec->x1; x++) {
						*tile_data++ = (*data++ - adjust) << 11;
					}
					
				}
			}
		}
		
		/*----------------MCT-------------------*/
		if (tcd_tcp->mct) {
			int samples = (tile->comps[0].x1 - tile->comps[0].x0) * (tile->comps[0].y1 - tile->comps[0].y0);
			if (tcd_tcp->tccps[0].qmfbid == 0) {
				mct_encode_real(tile->comps[0].data, tile->comps[1].data, tile->comps[2].data, samples);
			} else {
				mct_encode(tile->comps[0].data, tile->comps[1].data, tile->comps[2].data, samples);
			}
		}
		
		/*----------------DWT---------------------*/
		
		for (compno = 0; compno < tile->numcomps; compno++) {
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
			if (tcd_tcp->tccps[compno].qmfbid == 1) {
				dwt_encode(tilec);
			} else if (tcd_tcp->tccps[compno].qmfbid == 0) {
				dwt_encode_real(tilec);
			}
		}
		
		/*------------------TIER1-----------------*/
		t1 = t1_create(tcd->cinfo);
		t1_encode_cblks(t1, tile, tcd_tcp);
		t1_destroy(t1);
		
		/*-----------RATE-ALLOCATE------------------*/
		
		/* INDEX */
		if(cstr_info) {
			cstr_info->index_write = 0;
		}
		if (cp->disto_alloc || cp->fixed_quality) {	/* fixed_quality */
			/* Normal Rate/distortion allocation */
			tcd_rateallocate(tcd, dest, len, cstr_info);
		} else {
			/* Fixed layer allocation */
			tcd_rateallocate_fixed(tcd);
		}
	}
	/*--------------TIER2------------------*/

	/* INDEX */
	if(cstr_info) {
		cstr_info->index_write = 1;
	}

	t2 = t2_create(tcd->cinfo, image, cp);
	l = t2_encode_packets(t2,tileno, tile, tcd_tcp->numlayers, dest, len, cstr_info,tcd->tp_num,tcd->tp_pos,tcd->cur_pino,FINAL_PASS,tcd->cur_totnum_tp);
	t2_destroy(t2);
	
	/*---------------CLEAN-------------------*/

	
	if(tcd->cur_tp_num == tcd->cur_totnum_tp - 1){
		tcd->encoding_time = opj_clock() - tcd->encoding_time;
		opj_event_msg(tcd->cinfo, EVT_INFO, "- tile encoded in %f s\n", tcd->encoding_time);

		/* cleaning memory */
		for (compno = 0; compno < tile->numcomps; compno++) {
			opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
			opj_aligned_free(tilec->data);
		}
	}

	return l;
}